

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O3

void __thiscall Clasp::Clause::reason(Clause *this,Solver *s,Literal p,LitVec *out)

{
  anon_union_8_2_95510609_for_ClauseHead_1 *paVar1;
  uint32 *puVar2;
  uint uVar3;
  Literal *r;
  anon_union_8_2_95510609_for_ClauseHead_1 *paVar4;
  Literal *r_1;
  Literal *pLVar5;
  bool bVar6;
  Literal local_44;
  anon_union_8_2_95510609_for_ClauseHead_1 *local_40;
  Solver *local_38;
  
  local_44.rep_ =
       (this->super_ClauseHead).head_[((this->super_ClauseHead).head_[0].rep_ ^ p.rep_) < 2].rep_ &
       0xfffffffe ^ 2;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(out,&local_44);
  uVar3 = (this->super_ClauseHead).head_[2].rep_;
  if (3 < uVar3) {
    local_44.rep_ = uVar3 & 0xfffffffe ^ 2;
    local_38 = s;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(out,&local_44);
    paVar1 = &(this->super_ClauseHead).field_0;
    uVar3 = (this->super_ClauseHead).field_0.local_.mem[0];
    if ((uVar3 & 1) == 0) {
      bVar6 = 1 < (uVar3 ^ 2);
      paVar4 = (anon_union_8_2_95510609_for_ClauseHead_1 *)
               ((long)&(this->super_ClauseHead).field_0 + 4);
      if (!bVar6) {
        paVar4 = paVar1;
      }
      pLVar5 = (Literal *)
               ((long)paVar4 +
               (ulong)(1 < ((this->super_ClauseHead).head_[(ulong)bVar6 - 3].rep_ ^ 2)) * 4);
      paVar4 = paVar1;
    }
    else {
      paVar4 = (anon_union_8_2_95510609_for_ClauseHead_1 *)(this + 1);
      pLVar5 = (this->super_ClauseHead).head_ + (uVar3 >> 3);
    }
    if (paVar4 != (anon_union_8_2_95510609_for_ClauseHead_1 *)pLVar5) {
      local_40 = paVar1;
      do {
        local_44.rep_ = (paVar4->local_).mem[0] & 0xfffffffe ^ 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (out,&local_44);
        paVar4 = (anon_union_8_2_95510609_for_ClauseHead_1 *)((long)paVar4 + 4);
      } while (paVar4 != (anon_union_8_2_95510609_for_ClauseHead_1 *)pLVar5);
      uVar3 = (local_40->local_).mem[0];
    }
    s = local_38;
    if ((~uVar3 & 3) == 0) {
      do {
        local_44.rep_ = pLVar5->rep_ & 0xfffffffe ^ 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (out,&local_44);
        puVar2 = &pLVar5->rep_;
        pLVar5 = pLVar5 + 1;
      } while ((*puVar2 & 1) == 0);
    }
  }
  if (((this->super_ClauseHead).info_.super_ConstraintScore.rep & 0x30000000) != 0) {
    Solver::updateOnReason(s,&(this->super_ClauseHead).info_.super_ConstraintScore,p,out);
  }
  return;
}

Assistant:

void Clause::reason(Solver& s, Literal p, LitVec& out) {
	out.push_back(~head_[p == head_[0]]);
	if (!isSentinel(head_[2])) {
		out.push_back(~head_[2]);
		LitRange t = tail();
		for (const Literal* r = t.first; r != t.second; ++r) {
			out.push_back(~*r);
		}
		if (contracted()) {
			const Literal* r = t.second;
			do { out.push_back(~*r); } while (!r++->flagged());
		}
	}
	if (learnt()) {
		s.updateOnReason(info_.score(), p, out);
	}
}